

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piecewise_linear.cpp
# Opt level: O3

void __thiscall
mp::
PLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>_>
::PLApproximator(PLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>_>
                 *this,PowConstExpConstraint *con,PLApproxParams *p)

{
  initializer_list<double> __l;
  allocator_type local_39;
  double local_38 [4];
  
  (this->
  super_BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>_>
  ).con_ = con;
  (this->
  super_BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>_>
  ).laPrm_ = p;
  (this->
  super_BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>_>
  ).lbx_ = -1e+100;
  (this->
  super_BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>_>
  ).ubx_ = 1e+100;
  (this->
  super_BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>_>
  ).iSubIntv_ = -100;
  (this->
  super_BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>_>
  ).breakpoints_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->
  super_BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>_>
  ).breakpoints_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (this->
  super_BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>_>
  ).breakpoints_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  (this->
  super_BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>_>
  )._vptr_BasicPLApproximator = (_func_int **)&PTR__PLApproximator_004508a8;
  (this->rngAccepted_).lb = -1e+100;
  (this->rngAccepted_).ub = 1e+100;
  (this->fgd_).lbx = -1000000.0;
  (this->fgd_).ubx = 1000000.0;
  (this->fgd_).lby = -1000000.0;
  (this->fgd_).uby = 1000000.0;
  this->fMonotone = false;
  local_38[0] = -1000000.0;
  local_38[1] = 0.0;
  local_38[2] = 1000000.0;
  __l._M_len = 3;
  __l._M_array = local_38;
  std::vector<double,_std::allocator<double>_>::vector(&this->bpl_,__l,&local_39);
  InitPowDomain(this);
  return;
}

Assistant:

PLApproximator(const PowConstExpConstraint& con, PLApproxParams& p) :
    BasicPLApproximator<PowConstExpConstraint>(con, p) {
    InitPowDomain();
  }